

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ClipControlInitialState::iterate(ClipControlInitialState *this)

{
  TestContext *this_00;
  bool bVar1;
  char *description;
  TestError *this_01;
  
  bVar1 = ClipControlBaseTest::verifyState(&this->super_ClipControlBaseTest,0x8ca1,0x935e);
  if (bVar1) {
    this_00 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = qpGetTestResultName(QP_TEST_RESULT_PASS);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,description);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,
             "Wrong intitial state: GL_CLIP_ORIGIN should be GL_LOWER_LEFT, GL_CLIP_ORIGIN should be NEGATIVE_ONE_TO_ONE"
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
             ,0xf2);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		if (!verifyState(GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE))
		{
			TCU_FAIL("Wrong intitial state: GL_CLIP_ORIGIN should be GL_LOWER_LEFT,"
					 " GL_CLIP_ORIGIN should be NEGATIVE_ONE_TO_ONE");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, qpGetTestResultName(QP_TEST_RESULT_PASS));
		return STOP;
	}